

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O0

Gia_Man_t * Bmc_EcoMiter(Gia_Man_t *pGold,Gia_Man_t *pOld,Vec_Int_t *vFans)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  bool bVar9;
  int local_4c;
  int Miter;
  int NewPi;
  int i;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pRoot;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vFans_local;
  Gia_Man_t *pOld_local;
  Gia_Man_t *pGold_local;
  
  iVar1 = Gia_ManPoNum(pOld);
  pGVar6 = Gia_ManPo(pOld,iVar1 + -1);
  pGVar6 = Gia_ObjFanin0(pGVar6);
  iVar1 = Gia_ManCiNum(pGold);
  iVar2 = Gia_ManCiNum(pOld);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x36,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManCoNum(pGold);
  iVar2 = Gia_ManCoNum(pOld);
  if (iVar1 != iVar2 + -1) {
    __assert_fail("Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x37,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ObjIsAnd(pGVar6);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x38,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(pGold);
  p = Gia_ManStart(iVar1 * 3);
  pcVar7 = Abc_UtilStrsav(pGold->pName);
  p->pName = pcVar7;
  Gia_ManHashAlloc(p);
  pGVar8 = Gia_ManConst0(pGold);
  pGVar8->Value = 0;
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGold->vCis);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCi(pGold,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar3 = Gia_ManAppendCi(p);
    _NewPi->Value = uVar3;
    Miter = Miter + 1;
  }
  uVar3 = Gia_ManAppendCi(p);
  Miter = 0;
  while( true ) {
    bVar9 = false;
    if (Miter < pGold->nObjs) {
      _NewPi = Gia_ManObj(pGold,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsAnd(_NewPi);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_NewPi);
      iVar2 = Gia_ObjFanin1Copy(_NewPi);
      uVar4 = Gia_ManHashAnd(p,iVar1,iVar2);
      _NewPi->Value = uVar4;
    }
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGold->vCos);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCo(pGold,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar4 = Gia_ObjFanin0Copy(_NewPi);
    _NewPi->Value = uVar4;
    Miter = Miter + 1;
  }
  pGVar8 = Gia_ManConst0(pOld);
  pGVar8->Value = 0;
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pOld->vCis);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCi(pOld,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    pGVar8 = Gia_ManCi(pGold,Miter);
    _NewPi->Value = pGVar8->Value;
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    bVar9 = false;
    if (Miter < pOld->nObjs) {
      _NewPi = Gia_ManObj(pOld,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsAnd(_NewPi);
    if (iVar1 != 0) {
      if (_NewPi == pGVar6) {
        _NewPi->Value = uVar3;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_NewPi);
        iVar2 = Gia_ObjFanin1Copy(_NewPi);
        uVar4 = Gia_ManHashAnd(p,iVar1,iVar2);
        _NewPi->Value = uVar4;
      }
    }
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pOld->vCos);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCo(pOld,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar4 = Gia_ObjFanin0Copy(_NewPi);
    _NewPi->Value = uVar4;
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGold->vCos);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCo(pGold,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar4 = _NewPi->Value;
    pGVar8 = Gia_ManCo(pOld,Miter);
    iVar1 = Gia_ManHashXor(p,uVar4,pGVar8->Value);
    Gia_ManAppendCo(p,iVar1);
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    bVar9 = false;
    if (Miter < pOld->nObjs) {
      _NewPi = Gia_ManObj(pOld,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsAnd(_NewPi);
    if (iVar1 != 0) {
      if (_NewPi == pGVar6) {
        uVar4 = Abc_LitNot(uVar3);
        _NewPi->Value = uVar4;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_NewPi);
        iVar2 = Gia_ObjFanin1Copy(_NewPi);
        uVar4 = Gia_ManHashAnd(p,iVar1,iVar2);
        _NewPi->Value = uVar4;
      }
    }
    Miter = Miter + 1;
  }
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pOld->vCos);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCo(pOld,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar3 = Gia_ObjFanin0Copy(_NewPi);
    _NewPi->Value = uVar3;
    Miter = Miter + 1;
  }
  local_4c = 0;
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGold->vCos);
    bVar9 = false;
    if (Miter < iVar1) {
      _NewPi = Gia_ManCo(pGold,Miter);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar3 = _NewPi->Value;
    pGVar6 = Gia_ManCo(pOld,Miter);
    iVar1 = Gia_ManHashXor(p,uVar3,pGVar6->Value);
    local_4c = Gia_ManHashOr(p,local_4c,iVar1);
    Miter = Miter + 1;
  }
  Gia_ManAppendCo(p,local_4c);
  Miter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFans);
    bVar9 = false;
    if (Miter < iVar1) {
      iVar1 = Vec_IntEntry(vFans,Miter);
      _NewPi = Gia_ManObj(pOld,iVar1);
      bVar9 = _NewPi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    Gia_ManAppendCo(p,_NewPi->Value);
    Miter = Miter + 1;
  }
  p_00 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  iVar1 = Gia_ManPiNum(p_00);
  iVar2 = Gia_ManCiNum(pGold);
  if (iVar1 != iVar2 + 1) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x65,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManPoNum(p_00);
  iVar2 = Gia_ManCoNum(pGold);
  iVar5 = Vec_IntSize(vFans);
  if (iVar1 != iVar2 + 1 + iVar5) {
    __assert_fail("Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x66,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes miter for ECO with given root node and fanins.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Bmc_EcoMiter( Gia_Man_t * pGold, Gia_Man_t * pOld, Vec_Int_t * vFans )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pRoot = Gia_ObjFanin0( Gia_ManPo(pOld, Gia_ManPoNum(pOld)-1) ); // fanin of the last PO
    Gia_Obj_t * pObj;
    int i, NewPi, Miter;
    assert( Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld) );
    assert( Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1 );
    assert( Gia_ObjIsAnd(pRoot) );
    // create the miter
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGold) );
    pNew->pName = Abc_UtilStrsav( pGold->pName );
    Gia_ManHashAlloc( pNew );
    // copy gold
    Gia_ManConst0(pGold)->Value = 0;
    Gia_ManForEachCi( pGold, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    NewPi = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( pGold, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pGold, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    // create onset
    Gia_ManConst0(pOld)->Value = 0;
    Gia_ManForEachCi( pOld, pObj, i )
        pObj->Value = Gia_ManCi(pGold, i)->Value;
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = NewPi;
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Gia_ManForEachCo( pGold, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    // create offset
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = Abc_LitNot(NewPi);
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Miter = 0;
    Gia_ManForEachCo( pGold, pObj, i )
        Miter = Gia_ManHashOr( pNew, Miter, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    Gia_ManAppendCo( pNew, Miter );
    // add outputs for the nodes
    Gia_ManForEachObjVec( vFans, pOld, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1 );
    assert( Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans) );
    return pNew;
}